

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

void __thiscall QDataStream::QDataStream(QDataStream *this,QByteArray *a)

{
  long lVar1;
  QObjectData *this_00;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QBuffer *buf;
  OpenModeFlag in_stack_ffffffffffffff9c;
  QByteArray *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar2;
  QObject *in_stack_ffffffffffffffb0;
  QObjectData *pQVar3;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QObject = (_func_int **)0x0;
  (in_RDI->d_ptr).d = (QObjectData *)0x0;
  *(undefined1 *)&in_RDI[1]._vptr_QObject = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_QObject + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_QObject + 2) = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_QObject + 3) = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_QObject + 4) = 0;
  *(undefined4 *)&in_RDI[1].d_ptr.d = 0x17;
  *(undefined2 *)((long)&in_RDI[1].d_ptr.d + 4) = 0;
  this_00 = (QObjectData *)operator_new(0x10);
  QBuffer::QBuffer((QBuffer *)this_00,in_RDI);
  uVar2 = 1;
  QObject::blockSignals(in_stack_ffffffffffffffb0,false);
  QBuffer::setData((QBuffer *)CONCAT44(uVar2,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0);
  pQVar3 = this_00;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c);
  (*(((QIODevice *)&pQVar3->_vptr_QObjectData)->super_QObject)._vptr_QObject[0xd])
            (pQVar3,(ulong)local_c);
  (in_RDI->d_ptr).d = this_00;
  *(undefined1 *)&in_RDI[1]._vptr_QObject = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream::QDataStream(const QByteArray &a)
{
    QBuffer *buf = new QBuffer;
#ifndef QT_NO_QOBJECT
    buf->blockSignals(true);
#endif
    buf->setData(a);
    buf->open(QIODevice::ReadOnly);
    dev = buf;
    owndev = true;
}